

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

void __thiscall
pybind11::detail::type_record::add_base
          (type_record *this,type_info *base,_func_void_ptr_void_ptr *caster)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long in_RDX;
  type_info *in_RSI;
  long in_RDI;
  string tname_1;
  string tname;
  type_info *base_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  allocator *reason;
  allocator local_231;
  string local_230 [16];
  string *in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffe17;
  type_index *in_stack_fffffffffffffe18;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [183];
  allocator local_49;
  string local_48 [32];
  type_index local_28;
  type_info *local_20;
  long local_18;
  type_info *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::type_index::type_index(&local_28,in_RSI);
  local_20 = get_type_info(in_stack_fffffffffffffe18,(bool)in_stack_fffffffffffffe17);
  if (local_20 == (type_info *)0x0) {
    pcVar1 = std::type_info::name(local_10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    clean_type_id(in_stack_fffffffffffffde0);
    pcVar1 = *(char **)(in_RDI + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,pcVar1,&local_101);
    std::operator+((char *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
    std::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
    pybind11_fail(in_stack_fffffffffffffd90);
  }
  if ((*(byte *)(in_RDI + 0x60) >> 3 & 1) != ((byte)local_20->field_0x90 >> 2 & 1)) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::type_info::name(local_10);
    reason = &local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,(char *)__lhs,reason);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    clean_type_id(in_stack_fffffffffffffde0);
    pcVar1 = *(char **)(in_RDI + 8);
    __rhs = &local_231;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,pcVar1,__rhs);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
    ;
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,(char *)__rhs);
    pybind11_fail((string *)reason);
  }
  list::append<_object*>((list *)in_stack_fffffffffffffd90,(_object **)in_stack_fffffffffffffd88);
  if (local_20->type->tp_dictoffset != 0) {
    *(byte *)(in_RDI + 0x60) = *(byte *)(in_RDI + 0x60) & 0xfd | 2;
  }
  if (local_18 != 0) {
    std::
    vector<std::pair<std::type_info_const*,void*(*)(void*)>,std::allocator<std::pair<std::type_info_const*,void*(*)(void*)>>>
    ::emplace_back<std::type_info_const*&,void*(*&)(void*)>
              ((vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
                *)in_stack_fffffffffffffd90,(type_info **)in_stack_fffffffffffffd88,
               (_func_void_ptr_void_ptr **)in_stack_fffffffffffffd80);
  }
  return;
}

Assistant:

PYBIND11_NOINLINE void add_base(const std::type_info &base, void *(*caster)(void *)) {
        auto base_info = detail::get_type_info(base, false);
        if (!base_info) {
            std::string tname(base.name());
            detail::clean_type_id(tname);
            pybind11_fail("generic_type: type \"" + std::string(name) +
                          "\" referenced unknown base type \"" + tname + "\"");
        }

        if (default_holder != base_info->default_holder) {
            std::string tname(base.name());
            detail::clean_type_id(tname);
            pybind11_fail("generic_type: type \"" + std::string(name) + "\" " +
                    (default_holder ? "does not have" : "has") +
                    " a non-default holder type while its base \"" + tname + "\" " +
                    (base_info->default_holder ? "does not" : "does"));
        }

        bases.append((PyObject *) base_info->type);

        if (base_info->type->tp_dictoffset != 0)
            dynamic_attr = true;

        if (caster)
            base_info->implicit_casts.emplace_back(type, caster);
    }